

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acmod.c
# Opt level: O1

int32 acmod_flags2list(acmod_t *acmod)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  uint *puVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  
  uVar1 = acmod->mdef->n_sen;
  if (acmod->compallsen == '\0') {
    uVar7 = (int)uVar1 % 0x20;
    puVar4 = acmod->senone_active_vec;
    if ((int)uVar1 < 0x20) {
      uVar2 = 0;
      iVar10 = 0;
      iVar8 = 0;
    }
    else {
      uVar6 = 0;
      iVar8 = 0xff;
      iVar10 = 0;
      uVar2 = 0;
      do {
        if (*puVar4 != 0) {
          lVar3 = 0;
          iVar5 = iVar8;
          do {
            if ((*puVar4 & (uint)(1L << ((byte)lVar3 & 0x3f))) != 0) {
              iVar11 = (int)lVar3 + (int)uVar6 * 0x20;
              iVar9 = iVar11 - iVar10;
              if (0xff < iVar9) {
                uVar2 = (ulong)(int)uVar2;
                iVar10 = iVar5 - iVar10;
                do {
                  acmod->senone_active[uVar2] = 0xff;
                  uVar2 = uVar2 + 1;
                  iVar9 = iVar9 + -0xff;
                  iVar10 = iVar10 + -0xff;
                } while (0x1fe < iVar10);
              }
              iVar10 = (int)uVar2;
              uVar2 = (ulong)(iVar10 + 1);
              acmod->senone_active[iVar10] = (uint8)iVar9;
              iVar10 = iVar11;
            }
            lVar3 = lVar3 + 1;
            iVar5 = iVar5 + 1;
          } while (lVar3 != 0x20);
        }
        uVar6 = uVar6 + 1;
        puVar4 = puVar4 + 1;
        iVar8 = iVar8 + 0x20;
      } while (uVar6 != uVar1 >> 5);
      iVar8 = (int)uVar6 << 5;
    }
    uVar1 = (uint)uVar2;
    if (0 < (int)uVar7) {
      iVar5 = iVar8 + 0xff;
      uVar6 = 0;
      do {
        if ((*puVar4 & (uint)(1L << ((byte)uVar6 & 0x3f))) != 0) {
          iVar9 = (int)uVar6 + iVar8;
          iVar11 = iVar9 - iVar10;
          if (0xff < iVar11) {
            uVar2 = (ulong)(int)uVar2;
            iVar10 = iVar5 - iVar10;
            do {
              acmod->senone_active[uVar2] = 0xff;
              uVar2 = uVar2 + 1;
              iVar11 = iVar11 + -0xff;
              iVar10 = iVar10 + -0xff;
            } while (0x1fe < iVar10);
          }
          iVar10 = (int)uVar2;
          uVar2 = (ulong)(iVar10 + 1);
          acmod->senone_active[iVar10] = (uint8)iVar11;
          iVar10 = iVar9;
        }
        uVar1 = (uint)uVar2;
        uVar6 = uVar6 + 1;
        iVar5 = iVar5 + 1;
      } while (uVar6 != uVar7);
    }
  }
  acmod->n_senone_active = uVar1;
  return uVar1;
}

Assistant:

int32
acmod_flags2list(acmod_t *acmod)
{
    int32 w, l, n, b, total_dists, total_words, extra_bits;
    bitvec_t *flagptr;

    total_dists = bin_mdef_n_sen(acmod->mdef);
    if (acmod->compallsen) {
        acmod->n_senone_active = total_dists;
        return total_dists;
    }
    total_words = total_dists / BITVEC_BITS;
    extra_bits = total_dists % BITVEC_BITS;
    w = n = l = 0;
    for (flagptr = acmod->senone_active_vec; w < total_words; ++w, ++flagptr) {
        if (*flagptr == 0)
            continue;
        for (b = 0; b < BITVEC_BITS; ++b) {
            if (*flagptr & (1UL << b)) {
                int32 sen = w * BITVEC_BITS + b;
                int32 delta = sen - l;
                /* Handle excessive deltas "lossily" by adding a few
                   extra senones to bridge the gap. */
                while (delta > 255) {
                    acmod->senone_active[n++] = 255;
                    delta -= 255;
                }
                acmod->senone_active[n++] = delta;
                l = sen;
            }
        }
    }

    for (b = 0; b < extra_bits; ++b) {
        if (*flagptr & (1UL << b)) {
            int32 sen = w * BITVEC_BITS + b;
            int32 delta = sen - l;
            /* Handle excessive deltas "lossily" by adding a few
               extra senones to bridge the gap. */
            while (delta > 255) {
                acmod->senone_active[n++] = 255;
                delta -= 255;
            }
            acmod->senone_active[n++] = delta;
            l = sen;
        }
    }

    acmod->n_senone_active = n;
    E_DEBUG("acmod_flags2list: %d active in frame %d\n",
            acmod->n_senone_active, acmod->output_frame);
    return n;
}